

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

RotationY<double> *
qclab::qgates::operator/
          (RotationY<double> *__return_storage_ptr__,RotationY<double> *lhs,RotationY<double> *rhs)

{
  int iVar1;
  int iVar2;
  RotationY<double> *rhs_local;
  RotationY<double> *lhs_local;
  
  iVar1 = QGate1<double>::qubit((QGate1<double> *)lhs);
  iVar2 = (*(rhs->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>.
            _vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationY<double>::operator/=(lhs,rhs);
    RotationY<double>::RotationY(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xb9,"RotationY<T> qclab::qgates::operator/(RotationY<T>, const RotationY<T> &)");
}

Assistant:

RotationY< T > operator/( RotationY< T > lhs ,
                                         const RotationY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }